

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

bool P_AlignFlat(int linenum,int side,int fc)

{
  DAngle this;
  line_t *plVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sector_t *local_60;
  TAngle<double> local_58;
  double local_50;
  double dist;
  DAngle norm;
  DAngle angle;
  sector_t *sec;
  line_t *line;
  int fc_local;
  int side_local;
  int linenum_local;
  
  plVar1 = lines + linenum;
  if (side == 0) {
    local_60 = plVar1->frontsector;
  }
  else {
    local_60 = plVar1->backsector;
  }
  angle.Degrees = (double)local_60;
  if (local_60 == (sector_t *)0x0) {
    side_local._3_1_ = false;
  }
  else {
    line_t::Delta((line_t *)&norm);
    TVector2<double>::Angle((TVector2<double> *)&stack0xffffffffffffffd0);
    TAngle<double>::operator-((TAngle<double> *)&dist,90.0);
    dVar2 = TAngle<double>::Cos((TAngle<double> *)&dist);
    dVar3 = vertex_t::fX(plVar1->v1);
    dVar4 = TAngle<double>::Sin((TAngle<double> *)&dist);
    dVar5 = vertex_t::fY(plVar1->v1);
    local_50 = -(dVar2 * dVar3 + dVar4 * dVar5);
    if (side != 0) {
      TAngle<double>::operator+=((TAngle<double> *)&stack0xffffffffffffffd0,180.0);
      local_50 = -local_50;
    }
    this.Degrees = angle.Degrees;
    dVar2 = local_50;
    TAngle<double>::operator-(&local_58);
    sector_t::SetBase((sector_t *)this.Degrees,fc,dVar2,&local_58);
    side_local._3_1_ = true;
  }
  return side_local._3_1_;
}

Assistant:

bool P_AlignFlat (int linenum, int side, int fc)
{
	line_t *line = lines + linenum;
	sector_t *sec = side ? line->backsector : line->frontsector;

	if (!sec)
		return false;

	DAngle angle = line->Delta().Angle();
	DAngle norm = angle - 90;
	double dist = -(norm.Cos() * line->v1->fX() + norm.Sin() * line->v1->fY());

	if (side)
	{
		angle += 180.;
		dist = -dist;
	}

	sec->SetBase(fc, dist, -angle);
	return true;
}